

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

void If_DsdManHashProfile(If_DsdMan_t *p)

{
  int *piVar1;
  uint *puVar2;
  long lVar3;
  
  for (lVar3 = 0; lVar3 < p->nBins; lVar3 = lVar3 + 1) {
    puVar2 = p->pBins + lVar3;
    while (*puVar2 != 0) {
      piVar1 = (int *)Vec_PtrEntry(&p->vObjs,*puVar2);
      puVar2 = (uint *)Vec_IntEntryP(&p->vNexts,*piVar1);
    }
  }
  return;
}

Assistant:

void If_DsdManHashProfile( If_DsdMan_t * p )
{
    If_DsdObj_t * pObj;
    unsigned * pSpot;
    int i, Counter;
    for ( i = 0; i < p->nBins; i++ )
    {
        Counter = 0;
        for ( pSpot = p->pBins + i; *pSpot; pSpot = (unsigned *)Vec_IntEntryP(&p->vNexts, pObj->Id), Counter++ )
             pObj = If_DsdVecObj( &p->vObjs, *pSpot );
//        if ( Counter > 5 )
//            printf( "%d ", Counter );
//        if ( i > 10000 )
//            break;
    }
//    printf( "\n" );
}